

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::CloseCurrentPopup(void)

{
  int iVar1;
  ImGuiPopupData *pIVar2;
  ImGuiContext *pIVar3;
  ImGui *pIVar4;
  undefined1 restore_focus_to_window_under_popup;
  undefined1 extraout_DL;
  ImGuiWindow *pIVar5;
  ImGui *this;
  ulong uVar6;
  
  pIVar3 = GImGui;
  iVar1 = (GImGui->BeginPopupStack).Size;
  if ((0 < iVar1) && (iVar1 <= (GImGui->OpenPopupStack).Size)) {
    uVar6 = (ulong)(iVar1 - 1U);
    pIVar2 = (GImGui->OpenPopupStack).Data;
    pIVar5 = (ImGuiWindow *)(uVar6 * 0x38);
    if ((GImGui->BeginPopupStack).Data[uVar6].PopupId == pIVar2[uVar6].PopupId) {
      pIVar4 = (ImGui *)(ulong)(iVar1 - 1U);
      while (this = pIVar4, 0 < (int)this) {
        if ((pIVar2[(long)this].Window == (ImGuiWindow *)0x0) ||
           (((pIVar2[(long)this].Window)->Flags & 0x10000000) == 0)) goto LAB_0018df58;
        pIVar4 = (ImGui *)(ulong)((int)this - 1);
        pIVar5 = pIVar2[(long)pIVar4].Window;
        if ((pIVar5 == (ImGuiWindow *)0x0) || ((pIVar5->Flags & 0x400) != 0)) goto LAB_0018df58;
      }
      this = (ImGui *)0x0;
LAB_0018df58:
      restore_focus_to_window_under_popup = SUB81(pIVar5,0);
      if ((GImGui->DebugLogFlags & 4) != 0) {
        DebugLog("[popup] CloseCurrentPopup %d -> %d\n",uVar6,this);
        restore_focus_to_window_under_popup = extraout_DL;
      }
      ClosePopupToLevel(this,1,(bool)restore_focus_to_window_under_popup);
      if (pIVar3->NavWindow != (ImGuiWindow *)0x0) {
        (pIVar3->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window && !(parent_popup_window->Flags & ImGuiWindowFlags_MenuBar))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    IMGUI_DEBUG_LOG_POPUP("[popup] CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}